

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O2

void __thiscall
QuantLib::LineSearchBasedMethod::LineSearchBasedMethod
          (LineSearchBasedMethod *this,LineSearch *lineSearch)

{
  LineSearch *pLVar1;
  
  (this->super_OptimizationMethod)._vptr_OptimizationMethod =
       (_func_int **)&PTR__LineSearchBasedMethod_002c14d8;
  this->lineSearch_ = lineSearch;
  if (lineSearch != (LineSearch *)0x0) {
    return;
  }
  pLVar1 = (LineSearch *)operator_new(0x78);
  (pLVar1->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pLVar1->xtd_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->xtd_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->xtd_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pLVar1->gradient_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->gradient_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar1->qpt_ = 0.0;
  (pLVar1->gradient_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1->qt_ = 0.0;
  pLVar1->succeed_ = true;
  pLVar1->_vptr_LineSearch = (_func_int **)&PTR__LineSearch_002c3190;
  pLVar1[1]._vptr_LineSearch = (_func_int **)0x3fa999999999999a;
  pLVar1[1].searchDirection_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fe4cccccccccccd;
  this->lineSearch_ = pLVar1;
  return;
}

Assistant:

LineSearchBasedMethod::LineSearchBasedMethod(LineSearch* lineSearch) :
      lineSearch_(lineSearch) {
    if (!lineSearch_) lineSearch_ = new ArmijoLineSearch();
  }